

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O2

USTATUS __thiscall
FfsParser::parseCompressedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  byte bVar1;
  UINT8 subtype;
  char cVar2;
  TreeModel *pTVar3;
  bool bVar4;
  UINT32 UVar5;
  uint *puVar6;
  uint uVar7;
  byte *pbVar8;
  uint uVar9;
  UINT8 *ffsSize;
  undefined8 uVar10;
  UByteArray local_108;
  CBString info;
  UModelIndex parentVolumeIndex;
  CBString name;
  UByteArray body;
  UByteArray header;
  CBString local_60;
  UModelIndex local_48;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
      (parentVolumeIndex.m == (TreeModel *)0x0)) ||
     (bVar4 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar4)) {
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  }
  else {
    TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
    cVar2 = header.d._M_dataplus._M_p[0x19];
    std::__cxx11::string::~string((string *)&header);
    ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
    if ((cVar2 == '\x03') && (UVar5 = uint24ToUint32(ffsSize), UVar5 == 0xffffff)) {
      uVar7 = (uint)(section->d)._M_string_length;
      if (uVar7 < 0xd) {
        return 0x14;
      }
      puVar6 = (uint *)(ffsSize + 8);
      pbVar8 = ffsSize + 0xc;
      uVar10 = 0xd;
      goto LAB_0011a6d0;
    }
  }
  puVar6 = (uint *)(ffsSize + 4);
  pbVar8 = ffsSize + 8;
  uVar7 = (uint)(section->d)._M_string_length;
  uVar10 = 9;
LAB_0011a6d0:
  uVar9 = (uint)uVar10;
  if (uVar7 < uVar9) {
    return 0x14;
  }
  uVar7 = *puVar6;
  bVar1 = *pbVar8;
  UByteArray::left(&header,section,uVar9);
  UByteArray::mid(&body,section,uVar9,-1);
  sectionTypeToUString((CBString *)&local_108,ffsSize[3]);
  Bstrlib::CBString::CBString(&info," section");
  Bstrlib::CBString::operator+(&name,(CBString *)&local_108,&info);
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString((CBString *)&local_108);
  uVar9 = (uint)(section->d)._M_string_length;
  usprintf(&info,
           "Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)"
           ,(ulong)ffsSize[3],(ulong)uVar9,(ulong)uVar9,uVar10,uVar10,
           (ulong)(uint)body.d._M_string_length,(ulong)(uint)body.d._M_string_length,(ulong)bVar1,
           (ulong)uVar7,(ulong)uVar7);
  if (insertIntoTree) {
    pTVar3 = this->model;
    subtype = ffsSize[3];
    Bstrlib::CBString::CBString(&local_60);
    local_108.d._M_dataplus._M_p = (pointer)&local_108.d.field_2;
    local_108.d._M_string_length = 0;
    local_108.d.field_2._M_local_buf[0] = '\0';
    TreeModel::addItem(&local_48,pTVar3,localOffset,'C',subtype,&name,&local_60,&info,&header,&body,
                       &local_108,Movable,parent,'\0');
    index->m = local_48.m;
    index->r = local_48.r;
    index->c = local_48.c;
    index->i = CONCAT44(local_48.i._4_4_,(undefined4)local_48.i);
    std::__cxx11::string::~string((string *)&local_108);
    Bstrlib::CBString::~CBString(&local_60);
    local_48.i._0_4_ = 0;
    local_48.c = (int)bVar1;
    pTVar3 = this->model;
    local_48.r = uVar7;
    UByteArray::UByteArray(&local_108,(char *)&local_48,0xc);
    TreeModel::setParsingData(pTVar3,index,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  std::__cxx11::string::~string((string *)&body);
  std::__cxx11::string::~string((string *)&header);
  return 0;
}

Assistant:

USTATUS FfsParser::parseCompressedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    UINT8 compressionType;
    UINT32 uncompressedLength;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    else { // Normal section
        const EFI_COMPRESSION_SECTION* compressedSectionHeader = (const EFI_COMPRESSION_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_COMPRESSION_SECTION);
        compressionType = compressedSectionHeader->CompressionType;
        uncompressedLength = compressedSectionHeader->UncompressedLength;
    }
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize) {
        return U_INVALID_SECTION;
    }
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(sectionHeader->Type) + UString(" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nCompression type: %02Xh\nDecompressed size: %Xh (%u)",
                            sectionHeader->Type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            headerSize, headerSize,
                            (UINT32)body.size(), (UINT32)body.size(),
                            compressionType,
                            uncompressedLength, uncompressedLength);
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set section parsing data
        COMPRESSED_SECTION_PARSING_DATA pdata = {};
        pdata.compressionType = compressionType;
        pdata.uncompressedSize = uncompressedLength;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
    }
    
    return U_SUCCESS;
}